

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O0

void __thiscall ExchangePaths_ExportEmpty_Test::TestBody(ExchangePaths_ExportEmpty_Test *this)

{
  bool bVar1;
  uint generation;
  string *lhs;
  char *pcVar2;
  database *this_00;
  AssertHelper local_128;
  Message local_120;
  uint local_114;
  size_t local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  string local_d0;
  indent local_b0 [4];
  undefined1 local_a0 [8];
  ostringstream exported_strings_stream;
  undefined1 local_48 [8];
  string_mapping exported_strings;
  ExchangePaths_ExportEmpty_Test *this_local;
  
  exported_strings.strings_._M_h._M_single_bucket = (__node_base_ptr)this;
  pstore::exchange::export_ns::path_index_tag();
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)4>
            ((string_mapping *)local_48,&(this->super_ExchangePaths).export_db_);
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_a0);
  local_b0[0].distance_ = 0;
  pstore::exchange::export_ns::indent::indent(local_b0);
  this_00 = &(this->super_ExchangePaths).export_db_;
  generation = pstore::database::get_current_revision(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)4>
            ((ostream_base *)local_a0,local_b0[0],this_00,generation,&local_d0,
             (string_mapping *)local_48,false);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  lhs = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_a0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_e8,"exported_strings_stream.str ()","\"\"",lhs,(char (*) [1])0x2fa8e4
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_110 = pstore::exchange::export_ns::string_mapping::size((string_mapping *)local_48);
  local_114 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_108,"exported_strings.size ()","0U",&local_110,&local_114);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_a0);
  pstore::exchange::export_ns::string_mapping::~string_mapping((string_mapping *)local_48);
  return;
}

Assistant:

TEST_F (ExchangePaths, ExportEmpty) {
    using namespace pstore::exchange::export_ns;
    static constexpr auto comments = false;
    string_mapping exported_strings{export_db_, path_index_tag ()};
    ostringstream exported_strings_stream;
    emit_strings<pstore::trailer::indices::path> (exported_strings_stream, indent{}, export_db_,
                                                  export_db_.get_current_revision (), "",
                                                  &exported_strings, comments);

    EXPECT_EQ (exported_strings_stream.str (), "");
    EXPECT_EQ (exported_strings.size (), 0U);
}